

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O3

const_iterator __thiscall
GainBuckets::moveCell(GainBuckets *this,int old_gain,const_iterator old_iter,int new_gain)

{
  uint in_EAX;
  Bucket *__offin;
  Bucket *this_00;
  _List_node_base *p_Var1;
  __off64_t *in_R8;
  size_t in_R9;
  
  __offin = operator[][abi_cxx11_(this,old_gain);
  this_00 = operator[][abi_cxx11_(this,new_gain);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::splice
            (this_00,(int)(this_00->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl._M_node.super__List_node_base._M_next,(__off64_t *)__offin,
             (int)old_iter._M_node,in_R8,in_R9,in_EAX);
  if (this->best_gain_ < new_gain) {
    this->best_gain_ = new_gain;
  }
  else if (new_gain < old_gain && this->best_gain_ == old_gain) {
    while (p_Var1 = (_List_node_base *)operator[][abi_cxx11_(this,old_gain),
          (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1->_M_next)->_M_impl).
          _M_node.super__List_node_base._M_next == p_Var1) {
      old_gain = this->best_gain_ + -1;
      this->best_gain_ = old_gain;
    }
  }
  return (const_iterator)
         (this_00->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
         super__List_node_base._M_next;
}

Assistant:

GainBuckets::Bucket::const_iterator
GainBuckets::moveCell(int old_gain, Bucket::const_iterator old_iter, int new_gain) {
  auto &old_bucket = (*this)[old_gain], &new_bucket = (*this)[new_gain];
  new_bucket.splice(new_bucket.cbegin(), old_bucket, old_iter);
  if (new_gain > best_gain_)
    best_gain_ = new_gain;
  else if (old_gain == best_gain_ && new_gain < old_gain)
    while ((*this)[best_gain_].empty())
      --best_gain_;
  return new_bucket.cbegin();
}